

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

AliasRet aa_fref(jit_State *J,IRIns *refa,IRIns *refb)

{
  IRIns *stop;
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  IRIns *pIVar4;
  AliasRet AVar5;
  byte bVar6;
  IRIns *pIVar7;
  byte bVar8;
  
  AVar5 = ALIAS_NO;
  if ((refa->field_0).op2 == (refb->field_0).op2) {
    uVar1 = (refa->field_0).op1;
    uVar2 = (refb->field_0).op1;
    if (uVar1 == uVar2) {
      return ALIAS_MUST;
    }
    if ((ushort)((refa->field_0).op2 - 7) < 6) {
      pIVar3 = (J->cur).ir;
      bVar6 = *(char *)((long)pIVar3 + (ulong)uVar1 * 8 + 5) + 0xaf;
      bVar8 = *(char *)((long)pIVar3 + (ulong)uVar2 * 8 + 5) + 0xaf;
      AVar5 = ALIAS_NO;
      if (1 < (bVar8 | bVar6)) {
        stop = pIVar3 + uVar1;
        if (bVar8 < 2) {
          AVar5 = aa_escape(J,pIVar3 + uVar2,stop);
          return AVar5;
        }
        if (bVar6 < 2) {
          pIVar7 = stop;
          do {
            pIVar4 = pIVar7;
            pIVar7 = pIVar4 + 1;
            if (pIVar3 + uVar2 <= pIVar7) {
              return ALIAS_NO;
            }
          } while (((uint)*(ushort *)((long)pIVar4 + 10) !=
                    (uint)((ulong)((long)stop - (long)(J->cur).ir) >> 3)) ||
                  (3 < (byte)(*(char *)((long)pIVar4 + 0xd) + 0xb6U)));
          return ALIAS_MAY;
        }
        AVar5 = ALIAS_MAY;
      }
      return AVar5;
    }
    AVar5 = ALIAS_MAY;
  }
  return AVar5;
}

Assistant:

static AliasRet aa_fref(jit_State *J, IRIns *refa, IRIns *refb)
{
  if (refa->op2 != refb->op2)
    return ALIAS_NO;  /* Different fields. */
  if (refa->op1 == refb->op1)
    return ALIAS_MUST;  /* Same field, same object. */
  else if (refa->op2 >= IRFL_TAB_META && refa->op2 <= IRFL_TAB_NOMM)
    return aa_table(J, refa->op1, refb->op1);  /* Disambiguate tables. */
  else
    return ALIAS_MAY;  /* Same field, possibly different object. */
}